

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret.hpp
# Opt level: O1

void __thiscall duckdb::KeyValueSecret::KeyValueSecret(KeyValueSecret *this,BaseSecret *secret)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_a0;
  string local_88;
  string local_68;
  string local_48;
  
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_a0,
           &(secret->prefix_paths).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  pcVar2 = (secret->type)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + (secret->type)._M_string_length);
  pcVar2 = (secret->provider)._M_dataplus._M_p;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar2,pcVar2 + (secret->provider)._M_string_length);
  pcVar2 = (secret->name)._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + (secret->name)._M_string_length);
  BaseSecret::BaseSecret(&this->super_BaseSecret,&local_a0,&local_68,&local_88,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_a0);
  (this->super_BaseSecret)._vptr_BaseSecret = (_func_int **)&PTR__KeyValueSecret_019a0a58;
  p_Var1 = &(this->secret_map)._M_t._M_impl.super__Rb_tree_header;
  (this->secret_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->secret_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->secret_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->secret_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->secret_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->redact_keys)._M_h._M_buckets = &(this->redact_keys)._M_h._M_single_bucket;
  (this->redact_keys)._M_h._M_bucket_count = 1;
  (this->redact_keys)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->redact_keys)._M_h._M_element_count = 0;
  (this->redact_keys)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->redact_keys)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->redact_keys)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_BaseSecret).serializable = true;
  return;
}

Assistant:

explicit KeyValueSecret(const BaseSecret &secret)
	    : BaseSecret(secret.GetScope(), secret.GetType(), secret.GetProvider(), secret.GetName()) {
		serializable = true;
	}